

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void libtorrent::aux::expand_unspecified_address
               (span<const_libtorrent::aux::ip_interface> ifs,
               span<const_libtorrent::aux::ip_route> routes,
               vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
               *eps)

{
  span<const_libtorrent::aux::ip_route> routes_00;
  vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
  *this;
  bool bVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  pointer plVar6;
  difference_type extraout_RDX;
  anon_enum_32 aVar7;
  long lVar8;
  listen_endpoint_t *uep;
  __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
  _Var9;
  ip_interface *a;
  ip_interface *piVar10;
  pointer plVar11;
  pointer plVar12;
  pointer plVar13;
  span<const_libtorrent::aux::ip_route> routes_01;
  string_view device;
  ip_interface *__end3;
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  unspecified_eps;
  bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> local_a5;
  anon_enum_32 local_a4;
  pointer local_a0;
  vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
  *local_98;
  ip_route *local_90;
  ip_route *local_88;
  ip_interface *local_80;
  difference_type local_78;
  ip_interface *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  listen_endpoint_t *local_60;
  transport *local_58;
  int *local_50;
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  local_48;
  
  local_78 = ifs.m_len;
  local_80 = ifs.m_ptr;
  local_88 = (ip_route *)routes.m_len;
  local_90 = routes.m_ptr;
  _Var9._M_current =
       (eps->
       super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
       )._M_impl.super__Vector_impl_data._M_start;
  plVar12 = (eps->
            super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  plVar6 = _Var9._M_current;
  local_98 = (vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
              *)eps;
  if (_Var9._M_current != plVar12) {
LAB_002b77e7:
    do {
      _Var9._M_current = plVar6;
      if (((_Var9._M_current)->addr).type_ == ipv4) {
        if (((_Var9._M_current)->addr).ipv4_address_.addr_.s_addr == 0) goto LAB_002b7828;
      }
      else if ((((*(long *)&((_Var9._M_current)->addr).ipv6_address_.addr_.__in6_u == 0) &&
                ((int)*(undefined8 *)
                       ((long)&((_Var9._M_current)->addr).ipv6_address_.addr_.__in6_u + 8) == 0)) &&
               (((_Var9._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[0xd] == '\0' &&
                ((_Var9._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[0xc] == '\0')) &&
              ((((_Var9._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[0xe] == '\0' &&
               (((_Var9._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[0xf] == '\0')))) {
LAB_002b7828:
        plVar12 = plVar12 + -1;
        if (_Var9._M_current != plVar12) {
          do {
            if ((plVar12->addr).type_ == ipv4) {
              if ((plVar12->addr).ipv4_address_.addr_.s_addr != 0) goto LAB_002b7872;
            }
            else if (((*(long *)&(plVar12->addr).ipv6_address_.addr_.__in6_u != 0) ||
                     ((int)*(undefined8 *)((long)&(plVar12->addr).ipv6_address_.addr_.__in6_u + 8)
                      != 0)) ||
                    (((plVar12->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[0xd] != '\0' ||
                      (plVar12->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[0xc] != '\0' ||
                     (((plVar12->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[0xe] != '\0' ||
                      ((plVar12->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[0xf] != '\0'))))))
            goto LAB_002b7872;
            plVar12 = plVar12 + -1;
            if (plVar12 == _Var9._M_current) break;
          } while( true );
        }
        break;
      }
      _Var9._M_current = _Var9._M_current + 1;
      plVar6 = _Var9._M_current;
    } while (_Var9._M_current != plVar12);
  }
LAB_002b7893:
  this = local_98;
  ::std::
  vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>::
  vector<__gnu_cxx::__normal_iterator<libtorrent::aux::listen_endpoint_t*,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>>,void>
            ((vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
              *)&local_48,_Var9,*(listen_endpoint_t **)(local_98 + 8),(allocator_type *)&local_a5);
  ::std::
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>::
  _M_erase((vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
            *)this,(iterator)_Var9._M_current,*(listen_endpoint_t **)(this + 8));
  local_60 = local_48.
             super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    piVar10 = local_80 + local_78;
    _Var9._M_current =
         local_48.
         super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_70 = piVar10;
    do {
      if (local_78 != 0) {
        aVar7 = ((_Var9._M_current)->addr).type_;
        local_68 = &(_Var9._M_current)->device;
        local_50 = &(_Var9._M_current)->port;
        local_58 = &(_Var9._M_current)->ssl;
        a = local_80;
        local_a4 = aVar7;
        do {
          if (((a->preferred == true) && (((a->interface_address).type_ == ipv4) == (aVar7 == ipv4))
              ) && ((((_Var9._M_current)->device)._M_string_length == 0 ||
                    (iVar3 = ::std::__cxx11::string::compare((char *)local_68), iVar3 == 0)))) {
            plVar12 = *(pointer *)local_98;
            plVar6 = *(pointer *)(local_98 + 8);
            lVar4 = (long)plVar6 - (long)plVar12;
            lVar8 = (lVar4 >> 4) * 0x6db6db6db6db6db7 >> 2;
            if (0 < lVar8) {
              plVar13 = plVar12 + lVar8 * 4;
              lVar8 = lVar8 + 1;
              local_a0 = plVar6;
              do {
                bVar1 = __gnu_cxx::__ops::
                        _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                        ::operator()((_Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::__1>
                                      *)a,_Var9);
                plVar11 = plVar12;
                plVar6 = local_a0;
                aVar7 = local_a4;
                if (bVar1) goto LAB_002b7ab4;
                bVar1 = __gnu_cxx::__ops::
                        _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                        ::operator()((_Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::__1>
                                      *)a,_Var9);
                plVar11 = plVar12 + 1;
                plVar6 = local_a0;
                aVar7 = local_a4;
                if (bVar1) goto LAB_002b7ab4;
                bVar1 = __gnu_cxx::__ops::
                        _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                        ::operator()((_Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::__1>
                                      *)a,_Var9);
                plVar11 = plVar12 + 2;
                plVar6 = local_a0;
                aVar7 = local_a4;
                if (bVar1) goto LAB_002b7ab4;
                bVar1 = __gnu_cxx::__ops::
                        _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                        ::operator()((_Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::__1>
                                      *)a,_Var9);
                plVar11 = plVar12 + 3;
                plVar6 = local_a0;
                aVar7 = local_a4;
                if (bVar1) goto LAB_002b7ab4;
                plVar12 = plVar12 + 4;
                lVar8 = lVar8 + -1;
              } while (1 < lVar8);
              lVar4 = (long)local_a0 - (long)plVar13;
              piVar10 = local_70;
              plVar12 = plVar13;
            }
            aVar7 = local_a4;
            lVar4 = (lVar4 >> 4) * 0x6db6db6db6db6db7;
            if (lVar4 == 1) {
LAB_002b7a9d:
              bVar1 = __gnu_cxx::__ops::
                      _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                      ::operator()((_Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::__1>
                                    *)a,_Var9);
              plVar11 = plVar12;
              if (!bVar1) {
                plVar11 = plVar6;
              }
LAB_002b7ab4:
              piVar10 = local_70;
              if (plVar11 != plVar6) goto LAB_002b7bd6;
            }
            else {
              if (lVar4 == 2) {
LAB_002b7a82:
                bVar1 = __gnu_cxx::__ops::
                        _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                        ::operator()((_Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::__1>
                                      *)a,_Var9);
                plVar11 = plVar12;
                if (!bVar1) {
                  plVar12 = plVar12 + 1;
                  goto LAB_002b7a9d;
                }
                goto LAB_002b7ab4;
              }
              if (lVar4 == 3) {
                bVar1 = __gnu_cxx::__ops::
                        _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                        ::operator()((_Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::__1>
                                      *)a,_Var9);
                plVar11 = plVar12;
                if (!bVar1) {
                  plVar12 = plVar12 + 1;
                  goto LAB_002b7a82;
                }
                goto LAB_002b7ab4;
              }
            }
            if (((a->state == unknown) || (a->state == up)) && (((a->flags).m_val & 1) != 0)) {
              if ((a->interface_address).type_ == ipv4) {
                if ((char)(a->interface_address).ipv4_address_.addr_.s_addr != '\x7f')
                goto LAB_002b7b2c;
LAB_002b7bac:
                bVar2 = 6;
              }
              else {
                if (((*(long *)&(a->interface_address).ipv6_address_.addr_.__in6_u == 0) &&
                    ((int)*(undefined8 *)
                           ((long)&(a->interface_address).ipv6_address_.addr_.__in6_u + 8) == 0)) &&
                   (((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[0xd] == '\0' &&
                     (a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[0xc] == '\0' &&
                    (((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[0xe] == '\0' &&
                     ((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[0xf] == '\x01'))
                    )))) goto LAB_002b7bac;
LAB_002b7b2c:
                bVar1 = is_link_local(&a->interface_address);
                if ((bVar1) || (((a->flags).m_val & 4) != 0)) goto LAB_002b7bac;
                bVar1 = is_global(&a->interface_address);
                if (((bVar1) || (((a->flags).m_val & 8) != 0)) ||
                   (routes_01.m_len = extraout_RDX, routes_01.m_ptr = local_88,
                   bVar1 = has_any_internet_route((aux *)local_90,routes_01), !bVar1)) {
                  bVar2 = 4;
                }
                else {
                  sVar5 = strlen(a->name);
                  iVar3 = family(&a->interface_address);
                  routes_00.m_len = (difference_type)local_88;
                  routes_00.m_ptr = local_90;
                  device._M_str = a->name;
                  device._M_len = sVar5;
                  bVar1 = has_internet_route(device,iVar3,routes_00);
                  bVar2 = !bVar1 * '\x02' | 4;
                }
              }
              local_a5.m_val = bVar2 | ((_Var9._M_current)->flags).m_val;
              ::std::
              vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
              ::
              emplace_back<boost::asio::ip::address_const&,int_const&,std::__cxx11::string_const&,libtorrent::aux::transport_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::listen_socket_flags_tag,void>>
                        (local_98,&a->interface_address,local_50,local_68,local_58,&local_a5);
            }
          }
LAB_002b7bd6:
          a = a + 1;
        } while (a != piVar10);
      }
      _Var9._M_current = _Var9._M_current + 1;
    } while (_Var9._M_current != local_60);
  }
  ::std::
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>::
  ~vector(&local_48);
  return;
LAB_002b7872:
  ::std::swap<libtorrent::aux::listen_endpoint_t>(_Var9._M_current,plVar12);
  plVar6 = _Var9._M_current + 1;
  if (plVar12 == _Var9._M_current + 1) goto code_r0x002b788a;
  goto LAB_002b77e7;
code_r0x002b788a:
  _Var9._M_current = _Var9._M_current + 1;
  goto LAB_002b7893;
}

Assistant:

void expand_unspecified_address(span<ip_interface const> const ifs
		, span<ip_route const> const routes
		, std::vector<listen_endpoint_t>& eps)
	{
		auto unspecified_begin = std::partition(eps.begin(), eps.end()
			, [](listen_endpoint_t const& ep) { return !ep.addr.is_unspecified(); });
		std::vector<listen_endpoint_t> unspecified_eps(unspecified_begin, eps.end());
		eps.erase(unspecified_begin, eps.end());
		for (auto const& uep : unspecified_eps)
		{
			bool const v4 = uep.addr.is_v4();
			for (auto const& ipface : ifs)
			{
				if (!ipface.preferred)
					continue;
				if (ipface.interface_address.is_v4() != v4)
					continue;
				if (!uep.device.empty() && uep.device != ipface.name)
					continue;
				if (std::any_of(eps.begin(), eps.end(), [&](listen_endpoint_t const& e)
				{
					// ignore device name because we don't want to create
					// duplicates if the user explicitly configured an address
					// without a device name
					return e.addr == ipface.interface_address
						&& e.port == uep.port
						&& e.ssl == uep.ssl;
				}))
				{
					continue;
				}

				// ignore interfaces that are down
				if (ipface.state != if_state::up && ipface.state != if_state::unknown)
					continue;
				if (!(ipface.flags & if_flags::up))
					continue;

				// we assume this listen_socket_t is local-network under some
				// conditions, meaning we won't announce it to internet trackers
				// if "routes" does not contain a single route to the internet,
				// we don't use the last case. On MacOS, we can be notified of
				// network changes *before* the routing table is updated
				bool const local
					= ipface.interface_address.is_loopback()
					|| is_link_local(ipface.interface_address)
					|| (ipface.flags & if_flags::loopback)
					|| (!is_global(ipface.interface_address)
						&& !(ipface.flags & if_flags::pointopoint)
						&& has_any_internet_route(routes)
						&& !has_internet_route(ipface.name, family(ipface.interface_address), routes));

				eps.emplace_back(ipface.interface_address, uep.port, uep.device
					, uep.ssl, uep.flags | listen_socket_t::was_expanded
					| (local ? listen_socket_t::local_network : listen_socket_flags_t{}));
			}
		}
	}